

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteInitDatabase(unqlite *pDB,SyMemBackend *pParent,char *zFilename,uint iFlags)

{
  uint iFlags_00;
  int rc;
  unqlite_db *pStorage;
  uint iFlags_local;
  char *zFilename_local;
  SyMemBackend *pParent_local;
  unqlite *pDB_local;
  
  SyMemBackendInitFromParent(&pDB->sMem,pParent);
  SyBlobInit(&pDB->sErr,&pDB->sMem);
  iFlags_00 = unqliteSanityzeFlag(iFlags);
  pDB_local._4_4_ = unqlitePagerOpen(sUnqlMPGlobal.pVfs,pDB,zFilename,iFlags_00);
  if ((pDB_local._4_4_ == 0) && (pDB_local._4_4_ = jx9_init(&(pDB->sDB).pJx9), pDB_local._4_4_ == 0)
     ) {
    pDB_local._4_4_ = 0;
  }
  return pDB_local._4_4_;
}

Assistant:

static int unqliteInitDatabase(
	unqlite *pDB,            /* Database handle */
	SyMemBackend *pParent,   /* Master memory backend */
	const char *zFilename,   /* Target database */
	unsigned int iFlags      /* Open flags */
	)
{
	unqlite_db *pStorage = &pDB->sDB;
	int rc;
	/* Initialize the memory subsystem */
	SyMemBackendInitFromParent(&pDB->sMem,pParent);
	SyBlobInit(&pDB->sErr,&pDB->sMem);
	/* Sanitize flags */
	iFlags = unqliteSanityzeFlag(iFlags);
	/* Init the pager and the transaction manager */
	rc = unqlitePagerOpen(sUnqlMPGlobal.pVfs,pDB,zFilename,iFlags);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Allocate a new Jx9 engine handle */
	rc = jx9_init(&pStorage->pJx9);
	if( rc != JX9_OK ){
		return rc;
	}
	return UNQLITE_OK;
}